

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer.cpp
# Opt level: O2

void __thiscall
adios2::core::engine::BP5Writer::WriteMetaMetadata
          (BP5Writer *this,
          vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
          *MetaMetaBlocks)

{
  pointer pMVar1;
  TransportMan *this_00;
  MetaMetaInfoBlock *b;
  pointer pMVar2;
  
  pMVar1 = (MetaMetaBlocks->
           super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  this_00 = &this->m_FileMetaMetadataManager;
  for (pMVar2 = (MetaMetaBlocks->
                super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
                )._M_impl.super__Vector_impl_data._M_start; pMVar2 != pMVar1; pMVar2 = pMVar2 + 1) {
    transportman::TransportMan::WriteFiles(this_00,(char *)&pMVar2->MetaMetaIDLen,8,-1);
    transportman::TransportMan::WriteFiles(this_00,(char *)&pMVar2->MetaMetaInfoLen,8,-1);
    transportman::TransportMan::WriteFiles(this_00,pMVar2->MetaMetaID,pMVar2->MetaMetaIDLen,-1);
    transportman::TransportMan::WriteFiles(this_00,pMVar2->MetaMetaInfo,pMVar2->MetaMetaInfoLen,-1);
  }
  transportman::TransportMan::FlushFiles(this_00,-1);
  return;
}

Assistant:

void BP5Writer::WriteMetaMetadata(
    const std::vector<format::BP5Base::MetaMetaInfoBlock> MetaMetaBlocks)
{
    for (auto &b : MetaMetaBlocks)
    {
        m_FileMetaMetadataManager.WriteFiles((char *)&b.MetaMetaIDLen, sizeof(size_t));
        m_FileMetaMetadataManager.WriteFiles((char *)&b.MetaMetaInfoLen, sizeof(size_t));
        m_FileMetaMetadataManager.WriteFiles((char *)b.MetaMetaID, b.MetaMetaIDLen);
        m_FileMetaMetadataManager.WriteFiles((char *)b.MetaMetaInfo, b.MetaMetaInfoLen);
    }
    m_FileMetaMetadataManager.FlushFiles();
}